

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::TestCaseTracking::SectionTracker::~SectionTracker(SectionTracker *this)

{
  pointer pcVar1;
  
  (this->super_TrackerBase).super_ITracker.super_SharedImpl<Catch::IShared>.super_IShared.
  super_NonCopyable._vptr_NonCopyable = (_func_int **)&PTR__SectionTracker_001bd228;
  std::
  vector<Catch::Ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Ptr<Catch::TestCaseTracking::ITracker>_>_>
  ::~vector(&(this->super_TrackerBase).m_children);
  pcVar1 = (this->super_TrackerBase).m_name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_TrackerBase).m_name.field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

TrackerBase::~TrackerBase() {}